

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O0

unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_> __thiscall
spoa::SisdAlignmentEngine::Create
          (SisdAlignmentEngine *this,AlignmentType type,AlignmentSubtype subtype,int8_t m,int8_t n,
          int8_t g,int8_t e,int8_t q,int8_t c)

{
  SisdAlignmentEngine *this_00;
  int8_t g_local;
  int8_t n_local;
  int8_t m_local;
  AlignmentSubtype subtype_local;
  AlignmentType type_local;
  
  this_00 = (SisdAlignmentEngine *)operator_new(0x20);
  SisdAlignmentEngine(this_00,type,subtype,m,n,g,e,q,c);
  std::unique_ptr<spoa::AlignmentEngine,std::default_delete<spoa::AlignmentEngine>>::
  unique_ptr<std::default_delete<spoa::AlignmentEngine>,void>
            ((unique_ptr<spoa::AlignmentEngine,std::default_delete<spoa::AlignmentEngine>> *)this,
             (pointer)this_00);
  return (__uniq_ptr_data<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>,_true,_true>
          )(__uniq_ptr_data<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<AlignmentEngine> SisdAlignmentEngine::Create(
    AlignmentType type,
    AlignmentSubtype subtype,
    std::int8_t m,
    std::int8_t n,
    std::int8_t g,
    std::int8_t e,
    std::int8_t q,
    std::int8_t c) {
  return std::unique_ptr<AlignmentEngine>(
      new SisdAlignmentEngine(type, subtype, m, n, g, e, q, c));
}